

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitCallI(ParseNodeCall *pnodeCall,BOOL fEvaluateComponents,BOOL fIsEval,BOOL fHasNewTarget,
              uint32 actualArgCount,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
              ProfileId callSiteId,AuxArray<unsigned_int> *spreadIndices)

{
  ParseNode *pnode;
  code *pcVar1;
  bool bVar2;
  ArgSlot givenArgCount;
  CallFlags e0;
  RegSlot RVar3;
  ByteCodeWriter *pBVar4;
  undefined4 *puVar5;
  ArenaAllocator *allocator;
  bool bVar6;
  CallIExtendedOptions local_51;
  RegSlot tmpReg_1;
  CallIExtendedOptions options;
  uint spreadIndicesSize;
  RegSlot tmpReg;
  ArgSlot actualArgSlotCount;
  bool isSuperCall;
  uint spreadExtraAlloc;
  CallFlags callFlags;
  OpCode op;
  ParseNode *pnodeTarget;
  ByteCodeGenerator *byteCodeGenerator_local;
  uint32 actualArgCount_local;
  BOOL fHasNewTarget_local;
  BOOL fIsEval_local;
  BOOL fEvaluateComponents_local;
  ParseNodeCall *pnodeCall_local;
  
  pnode = pnodeCall->pnodeTarget;
  tmpReg = 0;
  bVar6 = ((byte)pnodeCall->field_0x24 >> 3 & 1) != 0;
  givenArgCount = (ArgSlot)actualArgCount;
  if ((actualArgCount & 0xffff) != actualArgCount) {
    Js::Throw::OutOfMemory();
  }
  if ((fEvaluateComponents != 0) && (!bVar6)) {
    FuncInfo::ReleaseLoc(funcInfo,pnode);
  }
  if (((pnodeCall->super_ParseNode).field_0x1 & 1) != 0) {
    FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
  }
  if (fIsEval == 0) {
    _actualArgSlotCount = (CallFlags)bVar6;
    if (fHasNewTarget != 0) {
      e0 = Js::operator|(_actualArgSlotCount,CallFlags_ExtraArg);
      _actualArgSlotCount = Js::operator|(e0,CallFlags_NewTarget);
    }
    if (pnodeCall->spreadArgCount == 0) {
      spreadExtraAlloc._2_2_ = CallI;
      if (bVar6 || fHasNewTarget != 0) {
        spreadExtraAlloc._2_2_ = CallIFlags;
      }
    }
    else {
      spreadExtraAlloc._2_2_ = CallIExtended;
      if (bVar6 || fHasNewTarget != 0) {
        spreadExtraAlloc._2_2_ = CallIExtendedFlags;
      }
    }
  }
  else {
    spreadExtraAlloc._2_2_ = CallIExtendedFlags;
    _actualArgSlotCount = CallFlags_ExtraArg;
  }
  if ((spreadExtraAlloc._2_2_ == CallI) || (spreadExtraAlloc._2_2_ == CallIFlags)) {
    if (bVar6) {
      RVar3 = ByteCodeGenerator::EmitLdObjProto
                        (byteCodeGenerator,LdFuncObjProto,pnode->location,funcInfo);
      pBVar4 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::CallI
                (pBVar4,spreadExtraAlloc._2_2_,(pnodeCall->super_ParseNode).location,RVar3,
                 givenArgCount,callSiteId,_actualArgSlotCount);
    }
    else {
      pBVar4 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::CallI
                (pBVar4,spreadExtraAlloc._2_2_,(pnodeCall->super_ParseNode).location,pnode->location
                 ,givenArgCount,callSiteId,_actualArgSlotCount);
    }
  }
  else {
    tmpReg_1 = 0;
    local_51 = CallIExtended_None;
    if (pnodeCall->spreadArgCount != 0) {
      if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2054,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      tmpReg = UInt32Math::Mul(spreadIndices->count,4);
      tmpReg_1 = UInt32Math::Add(4,tmpReg);
      local_51 = CallIExtended_SpreadArgs;
    }
    if (bVar6) {
      RVar3 = ByteCodeGenerator::EmitLdObjProto
                        (byteCodeGenerator,LdFuncObjProto,pnode->location,funcInfo);
      pBVar4 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::CallIExtended
                (pBVar4,spreadExtraAlloc._2_2_,(pnodeCall->super_ParseNode).location,RVar3,
                 givenArgCount,local_51,spreadIndices,tmpReg_1,callSiteId,_actualArgSlotCount);
    }
    else {
      pBVar4 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::CallIExtended
                (pBVar4,spreadExtraAlloc._2_2_,(pnodeCall->super_ParseNode).location,pnode->location
                 ,givenArgCount,local_51,spreadIndices,tmpReg_1,callSiteId,_actualArgSlotCount);
    }
  }
  if (pnodeCall->spreadArgCount != 0) {
    if (tmpReg == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2067,"(spreadExtraAlloc != 0)","spreadExtraAlloc != 0");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    allocator = ByteCodeGenerator::GetAllocator(byteCodeGenerator);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
              (allocator,spreadIndices,(ulong)tmpReg);
  }
  return;
}

Assistant:

void EmitCallI(
    ParseNodeCall *pnodeCall,
    BOOL fEvaluateComponents,
    BOOL fIsEval,
    BOOL fHasNewTarget,
    uint32 actualArgCount,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::AuxArray<uint32> *spreadIndices = nullptr)
{
    // Emit a call where the target is in a register, because it's either a local name or an expression we've
    // already evaluated.

    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    Js::OpCode op;
    Js::CallFlags callFlags = Js::CallFlags::CallFlags_None;
    uint spreadExtraAlloc = 0;
    bool isSuperCall = pnodeCall->isSuperCall;

    Js::ArgSlot actualArgSlotCount = (Js::ArgSlot) actualArgCount;

    // check for integer overflow
    if ((size_t)actualArgSlotCount != actualArgCount)
    {
        Js::Throw::OutOfMemory();
    }

    
    if (fEvaluateComponents && !isSuperCall)
    {
        // Release the call target operands we assigned above. If we didn't assign them here,
        // we'll need them later, so we can't re-use them for the result of the call.
        funcInfo->ReleaseLoc(pnodeTarget);
    }
    // Grab a register for the call result.
    if (pnodeCall->isUsed)
    {
        funcInfo->AcquireLoc(pnodeCall);
    }

    if (fIsEval)
    {
        op = Js::OpCode::CallIExtendedFlags;
        callFlags = Js::CallFlags::CallFlags_ExtraArg;
    }
    else
    {
        if (isSuperCall)
        {
            callFlags = Js::CallFlags_New;
        }
        if (fHasNewTarget)
        {
            callFlags = (Js::CallFlags) (callFlags | Js::CallFlags::CallFlags_ExtraArg | Js::CallFlags::CallFlags_NewTarget);
        }

        if (pnodeCall->spreadArgCount > 0)
        {
            op = (isSuperCall || fHasNewTarget) ? Js::OpCode::CallIExtendedFlags : Js::OpCode::CallIExtended;
        }
        else
        {
            op = (isSuperCall || fHasNewTarget) ? Js::OpCode::CallIFlags : Js::OpCode::CallI;
        }
    }

    if (op == Js::OpCode::CallI || op == Js::OpCode::CallIFlags)
    {
        if (isSuperCall)
        {
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeTarget->location, funcInfo);
            byteCodeGenerator->Writer()->CallI(op, pnodeCall->location, tmpReg, actualArgSlotCount, callSiteId, callFlags);
        }
        else
        {
            byteCodeGenerator->Writer()->CallI(op, pnodeCall->location, pnodeTarget->location, actualArgSlotCount, callSiteId, callFlags);
        }
    }
    else
    {
        uint spreadIndicesSize = 0;
        Js::CallIExtendedOptions options = Js::CallIExtended_None;

        if (pnodeCall->spreadArgCount > 0)
        {
            Assert(spreadIndices != nullptr);
            spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
            spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
            options = Js::CallIExtended_SpreadArgs;
        }

        if (isSuperCall)
        {
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeTarget->location, funcInfo);
            byteCodeGenerator->Writer()->CallIExtended(op, pnodeCall->location, tmpReg, actualArgSlotCount, options, spreadIndices, spreadIndicesSize, callSiteId, callFlags);
        }
        else
        {
            byteCodeGenerator->Writer()->CallIExtended(op, pnodeCall->location, pnodeTarget->location, actualArgSlotCount, options, spreadIndices, spreadIndicesSize, callSiteId, callFlags);
        }
    }

    if (pnodeCall->spreadArgCount > 0)
    {
        Assert(spreadExtraAlloc != 0);
        AdeletePlus(byteCodeGenerator->GetAllocator(), spreadExtraAlloc, spreadIndices);
    }
}